

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O1

void __thiscall wasm::StackIRGenerator::emitUnreachable(StackIRGenerator *this)

{
  Expression *origin;
  StackInst *local_20;
  
  origin = (Expression *)MixedArena::allocSpace(&this->module->allocator,0x10,8);
  origin->_id = UnreachableId;
  (origin->type).id = 1;
  local_20 = makeStackInst(this,Basic,origin);
  std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>::emplace_back<wasm::StackInst*>
            ((vector<wasm::StackInst*,std::allocator<wasm::StackInst*>> *)&this->stackIR,&local_20);
  return;
}

Assistant:

void emitUnreachable() {
    stackIR.push_back(makeStackInst(Builder(module).makeUnreachable()));
  }